

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O2

void storeRGBx64FromRGBA64PM_sse4
               (uchar *dest,QRgba64 *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  long lVar1;
  undefined1 auVar2 [16];
  QRgba64 QVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar14;
  float fVar15;
  undefined1 auVar13 [16];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar24 [16];
  
  auVar2 = _DAT_005c6ba0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (long)index;
  if ((MXCSR & 0x80) == 0) {
    uVar6 = 0;
    uVar8 = (ulong)(uint)count;
    if (count < 1) {
      uVar8 = uVar6;
    }
    for (; uVar8 * 8 != uVar6; uVar6 = uVar6 + 8) {
      QVar3 = QRgba64::unpremultiplied((QRgba64 *)((long)&src->rgba + uVar6));
      *(quint64 *)(dest + uVar6 + lVar4 * 8) = QVar3.rgba | 0xffff000000000000;
    }
  }
  else {
    lVar7 = 0;
    auVar11 = pmovsxbw(in_XMM2,0xff000000ff000000);
    for (; lVar7 < count + -3; lVar7 = lVar7 + 4) {
      auVar9 = *(undefined1 (*) [16])src;
      auVar10 = *(undefined1 (*) [16])(src + 2);
      auVar13 = (undefined1  [16])0x0;
      auVar17 = (undefined1  [16])0x0;
      if ((auVar11 & auVar9) != (undefined1  [16])0x0 ||
          (auVar11 & auVar10) != (undefined1  [16])0x0) {
        if ((auVar11 & ~auVar10) == (undefined1  [16])0x0 &&
            (auVar11 & ~auVar9) == (undefined1  [16])0x0) {
          auVar13 = auVar9 | auVar11;
          auVar17 = auVar10 | auVar11;
        }
        else {
          auVar17._0_8_ = auVar9._0_8_ >> 0x30;
          auVar17._8_8_ = auVar9._8_8_ >> 0x30;
          auVar18._0_8_ = auVar10._0_8_ >> 0x30;
          auVar18._8_8_ = auVar10._8_8_ >> 0x30;
          auVar13 = packusdw(auVar17,auVar18);
          auVar19._0_4_ = (float)auVar13._0_4_;
          auVar19._4_4_ = (float)auVar13._4_4_;
          auVar19._8_4_ = (float)auVar13._8_4_;
          auVar19._12_4_ = (float)auVar13._12_4_;
          auVar13 = rcpps(auVar13,auVar19);
          fVar12 = auVar13._0_4_;
          fVar14 = auVar13._4_4_;
          fVar15 = auVar13._8_4_;
          fVar16 = auVar13._12_4_;
          auVar20._0_4_ = auVar19._0_4_ * fVar12 * fVar12;
          auVar20._4_4_ = auVar19._4_4_ * fVar14 * fVar14;
          auVar20._8_4_ = auVar19._8_4_ * fVar15 * fVar15;
          auVar20._12_4_ = auVar19._12_4_ * fVar16 * fVar16;
          fVar12 = ((fVar12 + fVar12) - auVar20._0_4_) * 65535.0;
          fVar14 = ((fVar14 + fVar14) - auVar20._4_4_) * 65535.0;
          fVar15 = ((fVar15 + fVar15) - auVar20._8_4_) * 65535.0;
          fVar16 = ((fVar16 + fVar16) - auVar20._12_4_) * 65535.0;
          auVar13 = pmovzxwd(auVar20,auVar9);
          auVar24 = pmovzxwd(in_XMM10,auVar10);
          auVar21._0_4_ = (int)((float)auVar13._0_4_ * fVar12);
          auVar21._4_4_ = (int)((float)auVar13._4_4_ * fVar12);
          auVar21._8_4_ = (int)((float)auVar13._8_4_ * fVar12);
          auVar21._12_4_ = (int)((float)auVar13._12_4_ * fVar12);
          auVar22._0_4_ = (int)((float)auVar9._8_2_ * fVar14);
          auVar22._4_4_ = (int)((float)auVar9._10_2_ * fVar14);
          auVar22._8_4_ = (int)((float)auVar9._12_2_ * fVar14);
          auVar22._12_4_ = (int)((float)auVar9._14_2_ * fVar14);
          auVar17 = packusdw(auVar21,auVar22);
          auVar23._0_4_ = (int)((float)auVar24._0_4_ * fVar15);
          auVar23._4_4_ = (int)((float)auVar24._4_4_ * fVar15);
          auVar23._8_4_ = (int)((float)auVar24._8_4_ * fVar15);
          auVar23._12_4_ = (int)((float)auVar24._12_4_ * fVar15);
          in_XMM10._0_4_ = (float)auVar10._8_2_ * fVar16;
          in_XMM10._4_4_ = (float)auVar10._10_2_ * fVar16;
          in_XMM10._8_4_ = (float)auVar10._12_2_ * fVar16;
          in_XMM10._12_4_ = (float)auVar10._14_2_ * fVar16;
          auVar24._0_4_ = (int)in_XMM10._0_4_;
          auVar24._4_4_ = (int)in_XMM10._4_4_;
          auVar24._8_4_ = (int)in_XMM10._8_4_;
          auVar24._12_4_ = (int)in_XMM10._12_4_;
          auVar24 = packusdw(auVar23,auVar24);
          auVar9 = auVar9 ^ auVar2;
          auVar13._0_4_ = -(uint)(-0x7fff0001 < auVar9._0_4_);
          auVar13._4_4_ = -(uint)(-0x7fff0001 < auVar9._4_4_);
          auVar13._8_4_ = -(uint)(-0x7fff0001 < auVar9._8_4_);
          auVar13._12_4_ = -(uint)(-0x7fff0001 < auVar9._12_4_);
          auVar10 = auVar10 ^ auVar2;
          auVar9._0_4_ = -(uint)(-0x7fff0001 < auVar10._0_4_);
          auVar9._4_4_ = -(uint)(-0x7fff0001 < auVar10._4_4_);
          auVar9._8_4_ = -(uint)(-0x7fff0001 < auVar10._8_4_);
          auVar9._12_4_ = -(uint)(-0x7fff0001 < auVar10._12_4_);
          auVar13 = blendvpd(auVar11,auVar17 | auVar11,auVar13);
          auVar17 = blendvpd(auVar11,auVar24 | auVar11,auVar9);
        }
      }
      *(undefined1 (*) [16])(dest + lVar7 * 8 + lVar4 * 8) = auVar13;
      *(undefined1 (*) [16])(dest + lVar7 * 8 + lVar4 * 8 + 0x10) = auVar17;
      src = src + 4;
    }
    uVar5 = 0;
    for (; (uVar5 < 3 && (lVar7 < count)); lVar7 = lVar7 + 1) {
      QVar3 = QRgba64::unpremultiplied(src);
      *(quint64 *)(dest + lVar7 * 8 + lVar4 * 8) = QVar3.rgba | 0xffff000000000000;
      uVar5 = uVar5 + 1;
      src = src + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QT_FASTCALL storeRGBx64FromRGBA64PM_sse4(uchar *dest, const QRgba64 *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    QRgba64 *d = (QRgba64 *)dest + index;
    convertRGBA64FromRGBA64PM_sse4<true>(d, src, count);
}